

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O0

void write_double(bson *b,lua_Number d)

{
  int iVar1;
  int local_24;
  int i;
  anon_union_8_2_94730066 v;
  lua_Number d_local;
  bson *b_local;
  
  bson_reserve(b,8);
  for (local_24 = 0; local_24 < 0x40; local_24 = local_24 + 8) {
    iVar1 = b->size;
    b->size = iVar1 + 1;
    b->ptr[iVar1] = (uint8_t)((ulong)d >> ((byte)local_24 & 0x3f));
  }
  return;
}

Assistant:

static inline void
write_double(struct bson *b, lua_Number d) {
	union {
		double d;
		uint64_t i;
	} v;
	v.d = d;
	int i;
	bson_reserve(b,8);
	for (i=0;i<64;i+=8) {
		b->ptr[b->size++] = (v.i>>i) & 0xff;
	}
}